

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O2

void P_Start3dMidtexInterpolations
               (TArray<DInterpolation_*,_DInterpolation_*> *list,sector_t_conflict *sector,
               bool ceiling)

{
  extsector_t *peVar1;
  long lVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  uint i;
  ulong uVar4;
  DInterpolation *local_40;
  TArray<DInterpolation_*,_DInterpolation_*> *local_38;
  
  peVar1 = sector->e;
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000011,ceiling) << 5) | 0x10;
  local_38 = list;
  for (uVar4 = 0; uVar4 < *(uint *)((long)&(peVar1->Midtex).Floor.AttachedSectors.Count + uVar3);
      uVar4 = uVar4 + 1) {
    lVar2 = *(long *)(*(long *)((long)&(peVar1->Midtex).Floor.AttachedSectors.Array + uVar3) +
                     uVar4 * 8);
    local_40 = side_t::SetInterpolation(*(side_t **)(lVar2 + 0x48),1);
    TArray<DInterpolation_*,_DInterpolation_*>::Push(list,&local_40);
    local_40 = side_t::SetInterpolation(*(side_t **)(lVar2 + 0x50),1);
    TArray<DInterpolation_*,_DInterpolation_*>::Push(list,&local_40);
  }
  return;
}

Assistant:

void P_Start3dMidtexInterpolations(TArray<DInterpolation *> &list, sector_t *sector, bool ceiling)
{
	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	for(unsigned i = 0; i < scrollplane.AttachedLines.Size(); i++)
	{
		line_t *l = scrollplane.AttachedLines[i];

		list.Push(l->sidedef[0]->SetInterpolation(side_t::mid));
		list.Push(l->sidedef[1]->SetInterpolation(side_t::mid));
	}
}